

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O2

bool __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::isMeshInterfaceVar
          (BuiltInsValidator *this,Instruction *inst)

{
  uint32_t uVar1;
  uint32_t *puVar2;
  uint id;
  _Rb_tree<spv::ExecutionModel,_spv::ExecutionModel,_std::_Identity<spv::ExecutionModel>,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
  *this_00;
  const_iterator cVar3;
  const_iterator cVar4;
  vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>
  *pvVar5;
  Instruction *pIVar6;
  pointer pEVar7;
  uint32_t *puVar8;
  EntryPointDescription *desc;
  pointer pEVar9;
  size_t index;
  uint32_t *puVar10;
  uint32_t *puVar11;
  ValidationState_t *this_01;
  Instruction *pIVar12;
  key_type local_50 [2];
  Instruction *local_48;
  pointer local_40;
  uint32_t *local_38;
  
  puVar11 = (this->_->entry_points_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->_->entry_points_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_48 = inst;
  do {
    if (puVar11 == puVar2) {
LAB_0052914b:
      return puVar11 != puVar2;
    }
    uVar1 = *puVar11;
    this_00 = &ValidationState_t::GetExecutionModels(this->_,uVar1)->_M_t;
    local_50[1] = 0x14f5;
    cVar3 = std::
            _Rb_tree<spv::ExecutionModel,_spv::ExecutionModel,_std::_Identity<spv::ExecutionModel>,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
            ::find(this_00,local_50 + 1);
    if ((_Rb_tree_header *)cVar3._M_node == &(this_00->_M_impl).super__Rb_tree_header) {
      local_50[0] = ExecutionModelMeshNV;
      cVar4 = std::
              _Rb_tree<spv::ExecutionModel,_spv::ExecutionModel,_std::_Identity<spv::ExecutionModel>,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
              ::find(this_00,local_50);
      if (cVar4._M_node != cVar3._M_node) goto LAB_00529088;
    }
    else {
LAB_00529088:
      pvVar5 = ValidationState_t::entry_point_descriptions(this->_,uVar1);
      pEVar7 = (pvVar5->
               super__Vector_base<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      local_40 = pEVar7;
      for (pEVar9 = (pvVar5->
                    super__Vector_base<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>
                    )._M_impl.super__Vector_impl_data._M_start; pEVar9 != pEVar7;
          pEVar9 = pEVar9 + 1) {
        puVar8 = (pEVar9->interfaces).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        pIVar12 = local_48;
        local_38 = puVar8;
        for (puVar10 = (pEVar9->interfaces).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start; puVar10 != puVar8; puVar10 = puVar10 + 1) {
          if ((pIVar12->inst_).opcode == 0x1e) {
            pIVar6 = ValidationState_t::FindDef(this->_,*puVar10);
            uVar1 = (pIVar12->inst_).result_id;
            pIVar6 = ValidationState_t::FindDef(this->_,(pIVar6->inst_).type_id);
            this_01 = this->_;
            index = 2;
            while( true ) {
              id = Instruction::GetOperandAs<unsigned_int>(pIVar6,index);
              pIVar6 = ValidationState_t::FindDef(this_01,id);
              if ((pIVar6->inst_).opcode != 0x1c) break;
              this_01 = this->_;
              index = 1;
            }
            pEVar7 = local_40;
            puVar8 = local_38;
            pIVar12 = local_48;
            if (uVar1 == (pIVar6->inst_).result_id) goto LAB_0052914b;
          }
          else if ((pIVar12->inst_).result_id == *puVar10) goto LAB_0052914b;
        }
      }
    }
    puVar11 = puVar11 + 1;
  } while( true );
}

Assistant:

bool isMeshInterfaceVar(const Instruction& inst) {
    auto getUnderlyingTypeId = [&](const Instruction* ifxVar) {
      auto pointerTypeInst = _.FindDef(ifxVar->type_id());
      auto typeInst = _.FindDef(pointerTypeInst->GetOperandAs<uint32_t>(2));
      while (typeInst->opcode() == spv::Op::OpTypeArray) {
        typeInst = _.FindDef(typeInst->GetOperandAs<uint32_t>(1));
      };
      return typeInst->id();
    };

    for (const uint32_t entry_point : _.entry_points()) {
      const auto* models = _.GetExecutionModels(entry_point);
      if (models->find(spv::ExecutionModel::MeshEXT) != models->end() ||
          models->find(spv::ExecutionModel::MeshNV) != models->end()) {
        for (const auto& desc : _.entry_point_descriptions(entry_point)) {
          for (auto interface : desc.interfaces) {
            if (inst.opcode() == spv::Op::OpTypeStruct) {
              auto varInst = _.FindDef(interface);
              if (inst.id() == getUnderlyingTypeId(varInst)) return true;
            } else if (inst.id() == interface) {
              return true;
            }
          }
        }
      }
    }
    return false;
  }